

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.pb.h
# Opt level: O0

TestField * __thiscall
proto2_unittest::TestDiffMessage_Item::_internal_mutable_m(TestDiffMessage_Item *this)

{
  Arena *arena;
  TestField *pTVar1;
  TestField *p;
  TestDiffMessage_Item *this_local;
  
  if ((this->field_0)._impl_.m_ == (TestField *)0x0) {
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    pTVar1 = (TestField *)
             google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestField>(arena);
    (this->field_0)._impl_.m_ = pTVar1;
  }
  return (this->field_0)._impl_.m_;
}

Assistant:

inline ::proto2_unittest::TestField* PROTOBUF_NONNULL TestDiffMessage_Item::_internal_mutable_m() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.m_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestField>(GetArena());
    _impl_.m_ = reinterpret_cast<::proto2_unittest::TestField*>(p);
  }
  return _impl_.m_;
}